

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_timer.c
# Opt level: O2

int amqp_timer_update(amqp_timer_t *timer,timeval *timeout)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = timer->current_timestamp;
  uVar2 = amqp_get_monotonic_timestamp();
  timer->current_timestamp = uVar2;
  if (uVar1 == 0) {
    if (uVar2 != 0) {
      uVar3 = timeout->tv_usec * 1000 + timeout->tv_sec * 1000000000 + uVar2;
      timer->timeout_timestamp = uVar3;
      goto LAB_0010b601;
    }
  }
  else if (uVar2 != 0) {
    uVar3 = timer->timeout_timestamp;
LAB_0010b601:
    uVar4 = uVar3 - uVar2;
    if (uVar3 < uVar2) {
      return -0xd;
    }
    timer->ns_until_next_timeout = uVar4;
    (timer->tv).tv_sec = uVar4 / 1000000000;
    (timer->tv).tv_usec = (uVar4 % 1000000000) / 1000;
    return 0;
  }
  return -0xe;
}

Assistant:

int
amqp_timer_update(amqp_timer_t *timer, struct timeval *timeout)
{
  if (0 == timer->current_timestamp) {
    timer->current_timestamp = amqp_get_monotonic_timestamp();

    if (0 == timer->current_timestamp) {
      return AMQP_STATUS_TIMER_FAILURE;
    }

    timer->timeout_timestamp = timer->current_timestamp +
                               (uint64_t)timeout->tv_sec * AMQP_NS_PER_S +
                               (uint64_t)timeout->tv_usec * AMQP_NS_PER_US;

  } else {
    timer->current_timestamp = amqp_get_monotonic_timestamp();

    if (0 == timer->current_timestamp) {
      return AMQP_STATUS_TIMER_FAILURE;
    }
  }

  if (timer->current_timestamp > timer->timeout_timestamp) {
    return AMQP_STATUS_TIMEOUT;
  }

  timer->ns_until_next_timeout = timer->timeout_timestamp - timer->current_timestamp;

  memset(&timer->tv, 0, sizeof(struct timeval));
  timer->tv.tv_sec = timer->ns_until_next_timeout / AMQP_NS_PER_S;
  timer->tv.tv_usec = (timer->ns_until_next_timeout % AMQP_NS_PER_S) / AMQP_NS_PER_US;

  return AMQP_STATUS_OK;
}